

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

string * __thiscall
QPDF::getTrimmedUserPassword_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)(lVar1 + 0x70);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,*(long *)(lVar1 + 0x78) + lVar2);
  trim_user_password(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getTrimmedUserPassword() const
{
    std::string result = m->encp->user_password;
    trim_user_password(result);
    return result;
}